

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::IntegerFunctionCase::~IntegerFunctionCase(IntegerFunctionCase *this)

{
  IntegerFunctionCase *this_local;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__IntegerFunctionCase_032c2fb0;
  deinit(this);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->m_failMsg);
  deqp::gls::ShaderExecUtil::ShaderSpec::~ShaderSpec(&this->m_spec);
  gles31::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

IntegerFunctionCase::~IntegerFunctionCase (void)
{
	IntegerFunctionCase::deinit();
}